

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

int get_constraint_priority(TCGOpDef *def,int k)

{
  TCGArgConstraint *pTVar1;
  int local_30;
  int local_2c;
  int n;
  int i;
  TCGArgConstraint *arg_ct;
  int k_local;
  TCGOpDef *def_local;
  
  pTVar1 = def->args_ct + k;
  if ((pTVar1->ct & 0x80) == 0) {
    if ((pTVar1->ct & 1) == 0) {
      return 0;
    }
    local_30 = 0;
    for (local_2c = 0; local_2c < 0x20; local_2c = local_2c + 1) {
      if (((pTVar1->u).regs >> ((byte)local_2c & 0x1f) & 1) != 0) {
        local_30 = local_30 + 1;
      }
    }
  }
  else {
    local_30 = 1;
  }
  return 0x21 - local_30;
}

Assistant:

static int get_constraint_priority(const TCGOpDef *def, int k)
{
    const TCGArgConstraint *arg_ct;

    int i, n;
    arg_ct = &def->args_ct[k];
    if (arg_ct->ct & TCG_CT_ALIAS) {
        /* an alias is equivalent to a single register */
        n = 1;
    } else {
        if (!(arg_ct->ct & TCG_CT_REG))
            return 0;
        n = 0;
        for(i = 0; i < TCG_TARGET_NB_REGS; i++) {
            if (tcg_regset_test_reg(arg_ct->u.regs, i))
                n++;
        }
    }
    return TCG_TARGET_NB_REGS - n + 1;
}